

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O3

ON_SubDVertex * __thiscall ON_SubDEdge::OtherEndVertex(ON_SubDEdge *this,ON_SubDVertex *vertex)

{
  ON_SubDVertex *pOVar1;
  
  if (vertex != (ON_SubDVertex *)0x0) {
    pOVar1 = this->m_vertex[1];
    if (this->m_vertex[0] == vertex) {
      if (pOVar1 != vertex) {
        return pOVar1;
      }
    }
    else if (pOVar1 == vertex) {
      return this->m_vertex[0];
    }
  }
  return (ON_SubDVertex *)0x0;
}

Assistant:

const ON_SubDVertex* ON_SubDEdge::OtherEndVertex(
  const ON_SubDVertex* vertex
  ) const
{
  if (nullptr != vertex)
  {
    if (m_vertex[0] == vertex)
    {
      if (m_vertex[1] != vertex )
        return m_vertex[1];
    }
    else if (m_vertex[1] == vertex )
      return m_vertex[0];
  }
  return nullptr;
}